

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O1

RPCHelpMan * wallet::listsinceblock(void)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  long *plVar4;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string name_05;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  Fallback fallback_03;
  Fallback fallback_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  RPCArgOptions opts_04;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  undefined8 uVar13;
  RPCHelpMan *in_RDI;
  RPCResult *arg;
  pointer pRVar14;
  long lVar15;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  undefined4 in_stack_ffffffffffffe368;
  undefined4 uVar16;
  undefined4 in_stack_ffffffffffffe36c;
  undefined1 in_stack_ffffffffffffe370 [16];
  undefined8 in_stack_ffffffffffffe388;
  undefined8 in_stack_ffffffffffffe390;
  undefined8 in_stack_ffffffffffffe398;
  code *pcVar17;
  undefined8 in_stack_ffffffffffffe3a0;
  undefined1 in_stack_ffffffffffffe3a8 [16];
  pointer in_stack_ffffffffffffe3b8;
  pointer pRVar18;
  pointer in_stack_ffffffffffffe3c0;
  pointer in_stack_ffffffffffffe3c8;
  pointer pRVar19;
  pointer in_stack_ffffffffffffe3d0;
  pointer in_stack_ffffffffffffe3d8;
  pointer pRVar20;
  pointer in_stack_ffffffffffffe3e0;
  pointer pRVar21;
  pointer in_stack_ffffffffffffe3e8;
  pointer pRVar22;
  undefined8 in_stack_ffffffffffffe3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffe3f8;
  undefined1 in_stack_ffffffffffffe408 [16];
  pointer in_stack_ffffffffffffe418;
  pointer in_stack_ffffffffffffe420;
  pointer in_stack_ffffffffffffe428;
  undefined8 in_stack_ffffffffffffe430;
  pointer in_stack_ffffffffffffe438;
  pointer in_stack_ffffffffffffe440;
  pointer in_stack_ffffffffffffe448;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1bb0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b98;
  allocator_type local_1b79;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b78;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1af8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ad8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ab8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a98;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a78;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a40;
  RPCResults local_1a28;
  allocator_type local_1a0f;
  bool local_1a0e;
  bool local_1a0d;
  int local_1a0c;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1a08;
  string local_19f0;
  string local_19d0;
  string local_19b0;
  string local_1990;
  string local_1970;
  string local_1950;
  string local_1930;
  string local_1910;
  string local_18f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18d0;
  ulong *local_18b0;
  undefined8 local_18a8;
  ulong local_18a0;
  undefined8 uStack_1898;
  ulong *local_1890;
  size_type local_1888;
  ulong local_1880;
  undefined8 uStack_1878;
  long *local_1870 [2];
  long local_1860 [2];
  long *local_1850 [2];
  long local_1840 [2];
  long *local_1830 [2];
  long local_1820 [2];
  long *local_1810 [2];
  long local_1800 [2];
  RPCResult local_17f0;
  long *local_1768 [2];
  long local_1758 [2];
  long *local_1748 [2];
  long local_1738 [2];
  long *local_1728 [2];
  long local_1718 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1708;
  long *local_16e8 [2];
  long local_16d8 [2];
  pointer local_16c8 [2];
  undefined1 local_16b8 [152];
  RPCResult local_1620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1598;
  size_type *local_1578;
  size_type local_1570;
  size_type local_1568;
  undefined8 uStack_1560;
  long *local_1558 [2];
  long local_1548 [2];
  long *local_1538 [2];
  long local_1528 [2];
  long *local_1518 [2];
  long local_1508 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14f8;
  size_type *local_14d8;
  size_type local_14d0;
  size_type local_14c8;
  undefined8 uStack_14c0;
  long *local_14b8 [2];
  long local_14a8 [2];
  long *local_1498 [2];
  long local_1488 [2];
  long *local_1478 [2];
  long local_1468 [2];
  long *local_1458 [2];
  long local_1448 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1438;
  long *local_1418 [2];
  long local_1408 [2];
  pointer local_13f8 [2];
  undefined1 local_13e8 [152];
  RPCResult local_1350;
  RPCResult local_12c8;
  RPCResult local_1240;
  RPCResult local_11b8;
  RPCResult local_1130;
  long *local_10a8 [2];
  long local_1098 [2];
  long *local_1088 [2];
  long local_1078 [2];
  undefined1 local_1068 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ff0;
  long *local_fe0 [2];
  long local_fd0 [2];
  long *local_fc0 [2];
  long local_fb0 [2];
  RPCResult local_fa0;
  RPCResult local_f18;
  RPCResult local_e90;
  long *local_e08 [2];
  long local_df8 [2];
  long *local_de8 [2];
  long local_dd8 [2];
  RPCResult local_dc8;
  undefined1 local_d40;
  undefined1 *local_d38;
  undefined8 local_d30;
  undefined1 local_d28;
  undefined7 uStack_d27;
  undefined1 local_d18 [32];
  long *local_cf8 [2];
  long local_ce8 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_cd8;
  undefined1 local_c80;
  long *local_c78 [2];
  long local_c68 [2];
  undefined1 local_c58;
  undefined1 *local_c50;
  undefined8 local_c48;
  undefined1 local_c40;
  undefined7 uStack_c3f;
  undefined1 local_c30 [32];
  long *local_c10 [2];
  long local_c00 [2];
  UniValue local_bf0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_b98;
  undefined1 local_b40;
  long *local_b38 [2];
  long local_b28 [2];
  undefined1 local_b18;
  undefined1 *local_b10;
  undefined8 local_b08;
  undefined1 local_b00;
  undefined7 uStack_aff;
  undefined1 local_af0 [32];
  long *local_ad0 [2];
  long local_ac0 [2];
  UniValue local_ab0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_a58;
  undefined1 local_a00;
  long *local_9f8 [2];
  long local_9e8 [2];
  undefined1 local_9d8;
  undefined1 *local_9d0;
  undefined8 local_9c8;
  undefined1 local_9c0;
  undefined7 uStack_9bf;
  undefined1 local_9b0 [32];
  long *local_990 [2];
  long local_980 [2];
  uint *local_970;
  undefined8 local_968;
  uint local_960;
  undefined4 uStack_95c;
  undefined4 uStack_958;
  undefined4 uStack_954;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_950;
  undefined1 local_8f8;
  long *local_8f0 [2];
  long local_8e0 [2];
  undefined1 local_8d0;
  undefined1 *local_8c8;
  undefined8 local_8c0;
  undefined1 local_8b8;
  undefined7 uStack_8b7;
  undefined1 local_8a8 [32];
  long *local_888 [2];
  long local_878 [2];
  UniValue local_868;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_810;
  undefined1 local_7b8;
  long *local_7b0 [2];
  long local_7a0 [2];
  undefined1 local_790;
  vector<RPCArg,_std::allocator<RPCArg>_> local_788;
  undefined1 auStack_770 [8];
  undefined1 local_768 [32];
  long *local_748 [2];
  long local_738 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_728;
  undefined1 local_6d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c8;
  RPCArg local_6a8;
  RPCArg local_5a0;
  RPCArg local_498;
  RPCArg local_390;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1068._56_8_ = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"listsinceblock","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nGet all transactions in blocks since block [blockhash], or all transactions if omitted.\nIf \"blockhash\" is no longer a part of the main chain, transactions from the fork point onward are included.\nAdditionally, if include_removed is set, transactions affecting the wallet which were removed are returned in the \"removed\" array.\n"
             ,"");
  local_6c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_6c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"blockhash","");
  local_728._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_6d0 = 0;
  local_748[0] = local_738;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_748,
             "If set, the block hash to list transactions since, otherwise list all transactions.",
             "");
  local_788.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_788.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_790 = 0;
  local_788.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_788.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_768._0_8_ = (pointer)0x0;
  local_768._8_2_ = 0;
  local_768._10_6_ = 0;
  local_768._16_2_ = 0;
  local_768._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe368;
  name._8_16_ = in_stack_ffffffffffffe370;
  name.field_2._8_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe390;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe388;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe398;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe3a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe3a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe3b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe3c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe3c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe3d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe3d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe3e0;
  description_14._M_string_length = in_stack_ffffffffffffe3f0;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3e8;
  description_14.field_2 = in_stack_ffffffffffffe3f8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe418;
  opts.skip_type_check = (bool)in_stack_ffffffffffffe408[0];
  opts._1_7_ = in_stack_ffffffffffffe408._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe408._8_8_;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe420;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe428;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe430;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe438;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe440;
  opts._64_8_ = in_stack_ffffffffffffe448;
  ::RPCArg::RPCArg(&local_6a8,name,(Type)&local_6c8,fallback,description_14,opts);
  local_7b0[0] = local_7a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b0,"target_confirmations","");
  local_1a0c = 1;
  UniValue::UniValue<int,_int,_true>(&local_868,&local_1a0c);
  paVar12 = &local_868.val.field_2;
  local_810._8_8_ = (long)&local_810 + 0x18;
  local_810._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_868.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.val._M_dataplus._M_p == paVar12) {
    local_810._32_8_ = local_868.val.field_2._8_8_;
  }
  else {
    local_810._8_8_ = local_868.val._M_dataplus._M_p;
  }
  local_810._16_8_ = local_868.val._M_string_length;
  local_868.val._M_string_length = 0;
  local_868.val.field_2._M_local_buf[0] = '\0';
  local_810._40_8_ =
       local_868.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_810._48_8_ =
       local_868.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_810._56_8_ =
       local_868.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_868.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_868.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_868.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_810._64_4_ =
       local_868.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_810._68_4_ =
       local_868.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_810._72_4_ =
       local_868.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_810._76_4_ =
       local_868.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_810._80_8_ =
       local_868.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_868.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_868.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_868.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7b8 = 2;
  local_888[0] = local_878;
  local_868.val._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_888,
             "Return the nth block hash from the main chain. e.g. 1 would mean the best block hash. Note: this is not used as a filter, but only affects [lastblock] in the return value"
             ,"");
  local_8c8 = &local_8b8;
  local_8d0 = 0;
  local_8c0 = 0;
  local_8b8 = 0;
  local_8a8._0_8_ = (pointer)0x0;
  local_8a8._8_2_ = 0;
  local_8a8._10_6_ = 0;
  local_8a8._16_2_ = 0;
  local_8a8._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe368;
  name_00._8_16_ = in_stack_ffffffffffffe370;
  name_00.field_2._8_8_ = in_RDI;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe390;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe388;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe398;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe3a0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe3a8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe3b8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe3c0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe3c8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe3d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe3d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe3e0;
  description_15._M_string_length = in_stack_ffffffffffffe3f0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3e8;
  description_15.field_2 = in_stack_ffffffffffffe3f8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe418;
  opts_00.skip_type_check = (bool)in_stack_ffffffffffffe408[0];
  opts_00._1_7_ = in_stack_ffffffffffffe408._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe408._8_8_;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe420;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe428;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe430;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe438;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe440;
  opts_00._64_8_ = in_stack_ffffffffffffe448;
  ::RPCArg::RPCArg(&local_5a0,name_00,(Type)local_7b0,fallback_00,description_15,opts_00);
  local_8f0[0] = local_8e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f0,"include_watchonly","");
  local_970 = &local_960;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_970,"true for watch-only wallets, otherwise false","");
  local_950._0_8_ = (long)&local_950 + 0x10;
  if (local_970 == &local_960) {
    local_950._24_4_ = uStack_958;
    local_950._28_4_ = uStack_954;
  }
  else {
    local_950._0_8_ = local_970;
  }
  local_950._8_8_ = local_968;
  local_968 = 0;
  local_960 = local_960 & 0xffffff00;
  local_8f8 = 1;
  local_990[0] = local_980;
  local_970 = &local_960;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_990,
             "Include transactions to watch-only addresses (see \'importaddress\')","");
  local_9d0 = &local_9c0;
  local_9d8 = 0;
  local_9c8 = 0;
  local_9c0 = 0;
  local_9b0._0_8_ = (pointer)0x0;
  local_9b0._8_2_ = 0;
  local_9b0._10_6_ = 0;
  local_9b0._16_2_ = 0;
  local_9b0._18_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe368;
  name_01._8_16_ = in_stack_ffffffffffffe370;
  name_01.field_2._8_8_ = in_RDI;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe390;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe388;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe398;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe3a0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe3a8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe3b8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe3c0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe3c8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe3d0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe3d8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe3e0;
  description_16._M_string_length = in_stack_ffffffffffffe3f0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3e8;
  description_16.field_2 = in_stack_ffffffffffffe3f8;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe418;
  opts_01.skip_type_check = (bool)in_stack_ffffffffffffe408[0];
  opts_01._1_7_ = in_stack_ffffffffffffe408._1_7_;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe408._8_8_;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe420;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe428;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe430;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe438;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe440;
  opts_01._64_8_ = in_stack_ffffffffffffe448;
  ::RPCArg::RPCArg(&local_498,name_01,(Type)local_8f0,fallback_01,description_16,opts_01);
  local_9f8[0] = local_9e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"include_removed","");
  local_1a0d = true;
  UniValue::UniValue<bool,_bool,_true>(&local_ab0,&local_1a0d);
  paVar12 = &local_ab0.val.field_2;
  local_a58._8_8_ = (long)&local_a58 + 0x18;
  local_a58._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_ab0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab0.val._M_dataplus._M_p == paVar12) {
    local_a58._32_8_ = local_ab0.val.field_2._8_8_;
  }
  else {
    local_a58._8_8_ = local_ab0.val._M_dataplus._M_p;
  }
  local_a58._16_8_ = local_ab0.val._M_string_length;
  local_ab0.val._M_string_length = 0;
  local_ab0.val.field_2._M_local_buf[0] = '\0';
  local_a58._40_8_ =
       local_ab0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a58._48_8_ =
       local_ab0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a58._56_8_ =
       local_ab0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_ab0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ab0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ab0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a58._64_4_ =
       local_ab0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_a58._68_4_ =
       local_ab0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_a58._72_4_ =
       local_ab0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_a58._76_4_ =
       local_ab0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_a58._80_8_ =
       local_ab0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_ab0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ab0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ab0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a00 = 2;
  local_ad0[0] = local_ac0;
  local_ab0.val._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ad0,
             "Show transactions that were removed due to a reorg in the \"removed\" array\n(not guaranteed to work on pruned nodes)"
             ,"");
  local_b10 = &local_b00;
  local_b18 = 0;
  local_b08 = 0;
  local_b00 = 0;
  local_af0._0_8_ = (pointer)0x0;
  local_af0._8_2_ = 0;
  local_af0._10_6_ = 0;
  local_af0._16_2_ = 0;
  local_af0._18_8_ = 0;
  name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe368;
  name_02._8_16_ = in_stack_ffffffffffffe370;
  name_02.field_2._8_8_ = in_RDI;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe390;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe388;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe398;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe3a0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe3a8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe3b8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe3c0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe3c8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe3d0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe3d8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe3e0;
  description_17._M_string_length = in_stack_ffffffffffffe3f0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3e8;
  description_17.field_2 = in_stack_ffffffffffffe3f8;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe418;
  opts_02.skip_type_check = (bool)in_stack_ffffffffffffe408[0];
  opts_02._1_7_ = in_stack_ffffffffffffe408._1_7_;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe408._8_8_;
  opts_02.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe420;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe428;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe430;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe438;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe440;
  opts_02._64_8_ = in_stack_ffffffffffffe448;
  ::RPCArg::RPCArg(&local_390,name_02,(Type)local_9f8,fallback_02,description_17,opts_02);
  local_b38[0] = local_b28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b38,"include_change","");
  local_1a0e = false;
  UniValue::UniValue<bool,_bool,_true>(&local_bf0,&local_1a0e);
  paVar12 = &local_bf0.val.field_2;
  local_b98._8_8_ = (long)&local_b98 + 0x18;
  local_b98._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_bf0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0.val._M_dataplus._M_p == paVar12) {
    local_b98._32_8_ = local_bf0.val.field_2._8_8_;
  }
  else {
    local_b98._8_8_ = local_bf0.val._M_dataplus._M_p;
  }
  local_b98._16_8_ = local_bf0.val._M_string_length;
  local_bf0.val._M_string_length = 0;
  local_bf0.val.field_2._M_local_buf[0] = '\0';
  local_b98._40_8_ =
       local_bf0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b98._48_8_ =
       local_bf0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b98._56_8_ =
       local_bf0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_bf0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_bf0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bf0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b98._64_4_ =
       local_bf0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_b98._68_4_ =
       local_bf0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_b98._72_4_ =
       local_bf0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_b98._76_4_ =
       local_bf0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_b98._80_8_ =
       local_bf0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_bf0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_bf0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bf0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b40 = 2;
  local_c10[0] = local_c00;
  local_bf0.val._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c10,"Also add entries for change outputs.\n","");
  local_c50 = &local_c40;
  local_c58 = 0;
  local_c48 = 0;
  local_c40 = 0;
  local_c30._0_8_ = (pointer)0x0;
  local_c30._8_2_ = 0;
  local_c30._10_6_ = 0;
  local_c30._16_2_ = 0;
  local_c30._18_8_ = 0;
  name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe368;
  name_03._8_16_ = in_stack_ffffffffffffe370;
  name_03.field_2._8_8_ = in_RDI;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe390;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe388;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe398;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe3a0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe3a8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe3b8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe3c0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe3c8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe3d0;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe3d8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe3e0;
  description_18._M_string_length = in_stack_ffffffffffffe3f0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3e8;
  description_18.field_2 = in_stack_ffffffffffffe3f8;
  opts_03.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe418;
  opts_03.skip_type_check = (bool)in_stack_ffffffffffffe408[0];
  opts_03._1_7_ = in_stack_ffffffffffffe408._1_7_;
  opts_03.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe408._8_8_;
  opts_03.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe420;
  opts_03.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe428;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe430;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe438;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe440;
  opts_03._64_8_ = in_stack_ffffffffffffe448;
  ::RPCArg::RPCArg(&local_288,name_03,(Type)local_b38,fallback_03,description_18,opts_03);
  local_c78[0] = local_c68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c78,"label","");
  local_cd8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_c80 = 0;
  local_cf8[0] = local_ce8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cf8,
             "Return only incoming transactions paying to addresses with the specified label.\n","")
  ;
  local_d38 = &local_d28;
  local_d40 = 0;
  local_d30 = 0;
  local_d28 = 0;
  local_d18._0_8_ = (pointer)0x0;
  local_d18._8_2_ = 0;
  local_d18._10_6_ = 0;
  local_d18._16_2_ = 0;
  local_d18._18_8_ = 0;
  name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe368;
  name_04._8_16_ = in_stack_ffffffffffffe370;
  name_04.field_2._8_8_ = in_RDI;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe390;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe388;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffe398;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffe3a0;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffe3a8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe3b8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe3c0;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe3c8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe3d0;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe3d8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe3e0;
  description_19._M_string_length = in_stack_ffffffffffffe3f0;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3e8;
  description_19.field_2 = in_stack_ffffffffffffe3f8;
  opts_04.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe418;
  opts_04.skip_type_check = (bool)in_stack_ffffffffffffe408[0];
  opts_04._1_7_ = in_stack_ffffffffffffe408._1_7_;
  opts_04.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe408._8_8_;
  opts_04.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe420;
  opts_04.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe428;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe430;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe438;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe440;
  opts_04._64_8_ = in_stack_ffffffffffffe448;
  ::RPCArg::RPCArg(&local_180,name_04,(Type)local_c78,fallback_04,description_19,opts_04);
  __l._M_len = 6;
  __l._M_array = &local_6a8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1a08,__l,&local_1a0f);
  local_de8[0] = local_dd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_de8,"");
  local_e08[0] = local_df8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"");
  local_fc0[0] = local_fb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fc0,"transactions","");
  local_fe0[0] = local_fd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fe0,"");
  local_1088[0] = local_1078;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1088,"");
  local_10a8[0] = local_1098;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10a8,"");
  local_13f8[0] = (pointer)local_13e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13f8,"involvesWatchonly","");
  local_1418[0] = local_1408;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1418,
             "Only returns true if imported addresses were involved in transaction.","");
  local_1ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._4_16_ = in_stack_ffffffffffffe370;
  auVar5._0_4_ = in_stack_ffffffffffffe36c;
  auVar5._20_8_ = in_RDI;
  auVar5._28_4_ = 0;
  description._M_string_length = in_stack_ffffffffffffe390;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_13e8 + 0x10),BOOL,(string)(auVar5 << 0x20),SUB81(local_13f8,0),
             description,inner,true);
  local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1438,"address","");
  local_1458[0] = local_1448;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1458,
             "The bitcoin address of the transaction (not returned if the output does not have an address, e.g. OP_RETURN null data)."
             ,"");
  local_1af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar16 = 0;
  auVar6._4_16_ = in_stack_ffffffffffffe370;
  auVar6._0_4_ = in_stack_ffffffffffffe36c;
  auVar6._20_8_ = in_RDI;
  auVar6._28_4_ = 0;
  description_00._M_string_length = in_stack_ffffffffffffe390;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult
            (&local_1350,STR,(string)(auVar6 << 0x20),SUB81(&local_1438,0),description_00,inner_00,
             true);
  local_1478[0] = local_1468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1478,"category","");
  local_1498[0] = local_1488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1498,
             "The transaction category.\n\"send\"                  Transactions sent.\n\"receive\"               Non-coinbase transactions received.\n\"generate\"              Coinbase transactions received with more than 100 confirmations.\n\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n\"orphan\"                Orphaned coinbase transactions received."
             ,"");
  local_1b18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  m_key_name._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name._8_16_ = in_stack_ffffffffffffe370;
  m_key_name.field_2._8_8_ = in_RDI;
  description_01._M_string_length = in_stack_ffffffffffffe390;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult(&local_12c8,STR,m_key_name,description_01,inner_01,SUB81(local_1478,0));
  local_14b8[0] = local_14a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14b8,"amount","");
  std::operator+(&local_14f8,"The amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_14f8,
                       ". This is negative for the \'send\' category, and is positive\nfor all other categories"
                      );
  local_14d8 = &local_14c8;
  psVar1 = (size_type *)(pbVar10->_M_dataplus)._M_p;
  paVar12 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar12) {
    local_14c8 = paVar12->_M_allocated_capacity;
    uStack_14c0 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
  }
  else {
    local_14c8 = paVar12->_M_allocated_capacity;
    local_14d8 = psVar1;
  }
  local_14d0 = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  local_1b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_00._8_16_ = in_stack_ffffffffffffe370;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_02._M_string_length = in_stack_ffffffffffffe390;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult
            (&local_1240,STR_AMOUNT,m_key_name_00,description_02,inner_02,SUB81(local_14b8,0));
  local_1518[0] = local_1508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1518,"vout","");
  local_1538[0] = local_1528;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1538,"the vout value","");
  local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_01._8_16_ = in_stack_ffffffffffffe370;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_03._M_string_length = in_stack_ffffffffffffe390;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult(&local_11b8,NUM,m_key_name_01,description_03,inner_03,SUB81(local_1518,0));
  local_1558[0] = local_1548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1558,"fee","");
  std::operator+(&local_1598,"The amount of the fee in ",&::CURRENCY_UNIT_abi_cxx11_);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1598,
                       ". This is negative and only available for the\n\'send\' category of transactions."
                      );
  local_1578 = &local_1568;
  psVar1 = (size_type *)(pbVar10->_M_dataplus)._M_p;
  paVar12 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar12) {
    local_1568 = paVar12->_M_allocated_capacity;
    uStack_1560 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
  }
  else {
    local_1568 = paVar12->_M_allocated_capacity;
    local_1578 = psVar1;
  }
  local_1570 = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  local_1b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar16 = 0;
  auVar7._4_16_ = in_stack_ffffffffffffe370;
  auVar7._0_4_ = in_stack_ffffffffffffe36c;
  auVar7._20_8_ = in_RDI;
  auVar7._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffe390;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult
            (&local_1130,STR_AMOUNT,(string)(auVar7 << 0x20),SUB81(local_1558,0),description_04,
             inner_04,true);
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)(local_13e8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1ab8,__l_00,&local_1b79);
  TransactionDescriptionString();
  std::vector<RPCResult,_std::allocator<RPCResult>_>::reserve
            (&local_1ab8,
             ((long)local_1b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f +
             ((long)local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
  if (local_1b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar14 = local_1b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      std::vector<RPCResult,_std::allocator<RPCResult>_>::emplace_back<RPCResult>
                (&local_1ab8,pRVar14);
      pRVar14 = pRVar14 + 1;
    } while (pRVar14 !=
             local_1b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_16c8[0] = (pointer)local_16b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16c8,"abandoned","");
  local_16e8[0] = local_16d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e8,
             "\'true\' if the transaction has been abandoned (inputs are respendable).","");
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_02._8_16_ = in_stack_ffffffffffffe370;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_05._M_string_length = in_stack_ffffffffffffe390;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_16b8 + 0x10),BOOL,m_key_name_02,description_05,inner_05,
             SUB81(local_16c8,0));
  local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1708,"label","");
  local_1728[0] = local_1718;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1728,"A comment for the address/transaction, if any","");
  uVar16 = 0;
  auVar8._4_16_ = in_stack_ffffffffffffe370;
  auVar8._0_4_ = in_stack_ffffffffffffe36c;
  auVar8._20_8_ = in_RDI;
  auVar8._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffe390;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult
            (&local_1620,STR,(string)(auVar8 << 0x20),SUB81(&local_1708,0),description_06,inner_06,
             true);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)(local_16b8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1bb0,__l_01,(allocator_type *)&stack0xffffffffffffe417);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::reserve
            (&local_1a98,
             ((long)local_1bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f +
             ((long)local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
  if (local_1bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar14 = local_1bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      std::vector<RPCResult,_std::allocator<RPCResult>_>::emplace_back<RPCResult>
                (&local_1a98,pRVar14);
      pRVar14 = pRVar14 + 1;
    } while (pRVar14 !=
             local_1bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_1a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_03._8_16_ = in_stack_ffffffffffffe370;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_07._M_string_length = in_stack_ffffffffffffe390;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)local_1068,OBJ,m_key_name_03,description_07,inner_07,SUB81(local_1088,0));
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_1068;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1a58,__l_02,(allocator_type *)&stack0xffffffffffffe416);
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_04._8_16_ = in_stack_ffffffffffffe370;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_08._M_string_length = in_stack_ffffffffffffe390;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult(&local_fa0,ARR,m_key_name_04,description_08,inner_08,SUB81(local_fc0,0));
  local_1748[0] = local_1738;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1748,"removed","");
  local_1768[0] = local_1758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1768,
             "<structure is the same as \"transactions\" above, only present if include_removed=true>\nNote: transactions that were re-added in the active chain will appear as-is in this array, and may thus have a positive confirmation count."
             ,"");
  local_1810[0] = local_1800;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1810,"");
  local_1830[0] = local_1820;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1830,"");
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  pRVar22 = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_05._8_16_ = in_stack_ffffffffffffe370;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_09._M_string_length = in_stack_ffffffffffffe390;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult
            (&local_17f0,ELISION,m_key_name_05,description_09,inner_09,SUB81(local_1810,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_17f0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe3f8,__l_03,
             (allocator_type *)&stack0xffffffffffffe3d7);
  uVar16 = 0;
  auVar9._4_16_ = in_stack_ffffffffffffe370;
  auVar9._0_4_ = in_stack_ffffffffffffe36c;
  auVar9._20_8_ = in_RDI;
  auVar9._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffe390;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe3b8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult
            (&local_f18,ARR,(string)(auVar9 << 0x20),SUB81(local_1748,0),description_10,inner_10,
             true);
  local_1850[0] = local_1840;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1850,"lastblock","");
  local_1870[0] = local_1860;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1870,
             "The hash of the block (target_confirmations-1) from the best block on the main chain, or the genesis hash if the referenced block does not exist yet. This is typically used to feed back into listsinceblock the next time you call it. So you would generally use a target_confirmations of say 6, so you will be continually re-notified of transactions until they\'ve reached 6 confirmations plus any new ones"
             ,"");
  pRVar18 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_06._8_16_ = in_stack_ffffffffffffe370;
  m_key_name_06.field_2._8_8_ = in_RDI;
  description_11._M_string_length = in_stack_ffffffffffffe390;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult
            (&local_e90,STR_HEX,m_key_name_06,description_11,inner_11,SUB81(local_1850,0));
  __l_04._M_len = 3;
  __l_04._M_array = &local_fa0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1a40,__l_04,(allocator_type *)&stack0xffffffffffffe3b7);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe36c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar16;
  m_key_name_07._8_16_ = in_stack_ffffffffffffe370;
  m_key_name_07.field_2._8_8_ = in_RDI;
  description_12._M_string_length = in_stack_ffffffffffffe390;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe388;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffe398;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe3a0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar18;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  ::RPCResult::RPCResult(&local_dc8,OBJ,m_key_name_07,description_12,inner_12,SUB81(local_de8,0));
  result._4_4_ = in_stack_ffffffffffffe36c;
  result.m_type = uVar16;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe370._0_8_;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe370._8_8_;
  result.m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe388;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe390;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe398;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe3a0;
  result.m_optional = (bool)in_stack_ffffffffffffe3a8[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffe3a8[1];
  result._66_6_ = in_stack_ffffffffffffe3a8._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  result.m_description._M_string_length = (size_type)pRVar18;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar14;
  result.m_description.field_2._8_8_ = pRVar19;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe3d0;
  result.m_cond._M_string_length = (size_type)pRVar20;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar21;
  result.m_cond.field_2._8_8_ = pRVar22;
  RPCResults::RPCResults(&local_1a28,result);
  local_1910._M_dataplus._M_p = (pointer)&local_1910.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1910,"listsinceblock","");
  local_1930._M_dataplus._M_p = (pointer)&local_1930.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1930,"");
  HelpExampleCli(&local_18f0,&local_1910,&local_1930);
  local_1970._M_dataplus._M_p = (pointer)&local_1970.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1970,"listsinceblock","");
  local_1990._M_dataplus._M_p = (pointer)&local_1990.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1990,
             "\"000000000000000bacf66f7497b7dc45ef753ee9a7d38571037cdb1a57f663ad\" 6","");
  HelpExampleCli(&local_1950,&local_1970,&local_1990);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18f0._M_dataplus._M_p != &local_18f0.field_2) {
    uVar13 = local_18f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_1950._M_string_length + local_18f0._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1950._M_dataplus._M_p != &local_1950.field_2) {
      uVar13 = local_1950.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_1950._M_string_length + local_18f0._M_string_length)
    goto LAB_00314166;
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1950,0,0,local_18f0._M_dataplus._M_p,local_18f0._M_string_length);
  }
  else {
LAB_00314166:
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_18f0,local_1950._M_dataplus._M_p,local_1950._M_string_length);
  }
  local_18d0._M_dataplus._M_p = (pointer)&local_18d0.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar10->_M_dataplus)._M_p;
  paVar12 = &pbVar10->field_2;
  if (paVar2 == paVar12) {
    local_18d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_18d0.field_2._8_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 8);
    local_18d0.field_2._12_4_ = *(undefined4 *)((long)&pbVar10->field_2 + 0xc);
  }
  else {
    local_18d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_18d0._M_dataplus._M_p = (pointer)paVar2;
  }
  local_18d0._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar10->_M_string_length = 0;
  paVar12->_M_local_buf[0] = '\0';
  local_19d0._M_dataplus._M_p = (pointer)&local_19d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_19d0,"listsinceblock","");
  local_19f0._M_dataplus._M_p = (pointer)&local_19f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_19f0,
             "\"000000000000000bacf66f7497b7dc45ef753ee9a7d38571037cdb1a57f663ad\", 6","");
  HelpExampleRpc(&local_19b0,&local_19d0,&local_19f0);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18d0._M_dataplus._M_p != &local_18d0.field_2) {
    uVar13 = local_18d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_19b0._M_string_length + local_18d0._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_19b0._M_dataplus._M_p != &local_19b0.field_2) {
      uVar13 = local_19b0.field_2._M_allocated_capacity;
    }
    if (local_19b0._M_string_length + local_18d0._M_string_length <= (ulong)uVar13) {
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_19b0,0,0,local_18d0._M_dataplus._M_p,local_18d0._M_string_length);
      goto LAB_003142c7;
    }
  }
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_18d0,local_19b0._M_dataplus._M_p,local_19b0._M_string_length);
LAB_003142c7:
  local_18b0 = &local_18a0;
  puVar3 = (ulong *)(pbVar10->_M_dataplus)._M_p;
  paVar12 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar12) {
    local_18a0 = paVar12->_M_allocated_capacity;
    uStack_1898 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
  }
  else {
    local_18a0 = paVar12->_M_allocated_capacity;
    local_18b0 = puVar3;
  }
  local_1888 = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar10->_M_string_length = 0;
  paVar12->_M_local_buf[0] = '\0';
  if (local_18b0 == &local_18a0) {
    uStack_1878 = uStack_1898;
    local_1890 = &local_1880;
  }
  else {
    local_1890 = local_18b0;
  }
  local_1880 = local_18a0;
  local_18a8 = 0;
  local_18a0 = local_18a0 & 0xffffffffffffff00;
  pcVar17 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/transactions.cpp:602:9)>
            ::_M_manager;
  name_05._8_16_ = in_stack_ffffffffffffe370;
  name_05._M_dataplus._M_p = &stack0xffffffffffffe388;
  name_05.field_2._8_8_ = in_RDI;
  description_13.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/transactions.cpp:602:9)>
       ::_M_manager;
  description_13._M_dataplus._M_p = (pointer)0x0;
  description_13._M_string_length = 0;
  description_13.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/transactions.cpp:602:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar18;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe3a8._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe3a8._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar19;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe3d0;
  examples.m_examples._M_string_length = (size_type)pRVar21;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar20;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar22;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffe3f0;
  local_18b0 = &local_18a0;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_05,description_13,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar17 != (code *)0x0) {
    (*pcVar17)(&stack0xffffffffffffe388,&stack0xffffffffffffe388,3);
  }
  if (local_1890 != &local_1880) {
    operator_delete(local_1890,local_1880 + 1);
  }
  if (local_18b0 != &local_18a0) {
    operator_delete(local_18b0,local_18a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19b0._M_dataplus._M_p != &local_19b0.field_2) {
    operator_delete(local_19b0._M_dataplus._M_p,local_19b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19f0._M_dataplus._M_p != &local_19f0.field_2) {
    operator_delete(local_19f0._M_dataplus._M_p,local_19f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19d0._M_dataplus._M_p != &local_19d0.field_2) {
    operator_delete(local_19d0._M_dataplus._M_p,local_19d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18d0._M_dataplus._M_p != &local_18d0.field_2) {
    operator_delete(local_18d0._M_dataplus._M_p,local_18d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1950._M_dataplus._M_p != &local_1950.field_2) {
    operator_delete(local_1950._M_dataplus._M_p,local_1950.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1990._M_dataplus._M_p != &local_1990.field_2) {
    operator_delete(local_1990._M_dataplus._M_p,local_1990.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1970._M_dataplus._M_p != &local_1970.field_2) {
    operator_delete(local_1970._M_dataplus._M_p,local_1970.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18f0._M_dataplus._M_p != &local_18f0.field_2) {
    operator_delete(local_18f0._M_dataplus._M_p,local_18f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1930._M_dataplus._M_p != &local_1930.field_2) {
    operator_delete(local_1930._M_dataplus._M_p,local_1930.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1910._M_dataplus._M_p != &local_1910.field_2) {
    operator_delete(local_1910._M_dataplus._M_p,local_1910.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a28.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc8.m_cond._M_dataplus._M_p != &local_dc8.m_cond.field_2) {
    operator_delete(local_dc8.m_cond._M_dataplus._M_p,
                    local_dc8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc8.m_description._M_dataplus._M_p != &local_dc8.m_description.field_2) {
    operator_delete(local_dc8.m_description._M_dataplus._M_p,
                    local_dc8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_dc8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc8.m_key_name._M_dataplus._M_p != &local_dc8.m_key_name.field_2) {
    operator_delete(local_dc8.m_key_name._M_dataplus._M_p,
                    local_dc8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a40);
  lVar15 = 0x198;
  do {
    if ((long *)((long)local_fb0 + lVar15) != *(long **)((long)local_fc0 + lVar15)) {
      operator_delete(*(long **)((long)local_fc0 + lVar15),*(long *)((long)local_fb0 + lVar15) + 1);
    }
    if ((long *)((long)local_fd0 + lVar15) != *(long **)((long)local_fe0 + lVar15)) {
      operator_delete(*(long **)((long)local_fe0 + lVar15),*(long *)((long)local_fd0 + lVar15) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_1068 + lVar15 + 0x68));
    if ((long *)(local_1068 + lVar15 + 0x58) != *(long **)(local_1068 + lVar15 + 0x48)) {
      operator_delete(*(long **)(local_1068 + lVar15 + 0x48),
                      *(long *)(local_1068 + lVar15 + 0x58) + 1);
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe3b8);
  if (local_1870[0] != local_1860) {
    operator_delete(local_1870[0],local_1860[0] + 1);
  }
  if (local_1850[0] != local_1840) {
    operator_delete(local_1850[0],local_1840[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17f0.m_cond._M_dataplus._M_p != &local_17f0.m_cond.field_2) {
    operator_delete(local_17f0.m_cond._M_dataplus._M_p,
                    local_17f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17f0.m_description._M_dataplus._M_p != &local_17f0.m_description.field_2) {
    operator_delete(local_17f0.m_description._M_dataplus._M_p,
                    local_17f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_17f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17f0.m_key_name._M_dataplus._M_p != &local_17f0.m_key_name.field_2) {
    operator_delete(local_17f0.m_key_name._M_dataplus._M_p,
                    local_17f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe3d8);
  if (local_1830[0] != local_1820) {
    operator_delete(local_1830[0],local_1820[0] + 1);
  }
  if (local_1810[0] != local_1800) {
    operator_delete(local_1810[0],local_1800[0] + 1);
  }
  if (local_1768[0] != local_1758) {
    operator_delete(local_1768[0],local_1758[0] + 1);
  }
  if (local_1748[0] != local_1738) {
    operator_delete(local_1748[0],local_1738[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1068._104_8_ != &local_ff0) {
    operator_delete((void *)local_1068._104_8_,local_ff0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1068._72_8_ != local_1068 + 0x58) {
    operator_delete((void *)local_1068._72_8_,local_1068._88_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_1068 + 0x28));
  if ((undefined1 *)local_1068._8_8_ != local_1068 + 0x18) {
    operator_delete((void *)local_1068._8_8_,local_1068._24_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1bb0);
  lVar15 = 0x110;
  do {
    if ((long *)(local_16b8 + lVar15) != *(long **)((long)local_16c8 + lVar15)) {
      operator_delete(*(long **)((long)local_16c8 + lVar15),*(long *)(local_16b8 + lVar15) + 1);
    }
    if ((long *)((long)local_16d8 + lVar15) != *(long **)((long)local_16e8 + lVar15)) {
      operator_delete(*(long **)((long)local_16e8 + lVar15),*(long *)((long)local_16d8 + lVar15) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar15));
    if ((long *)((long)local_1718 + lVar15) != *(long **)((long)local_1728 + lVar15)) {
      operator_delete(*(long **)((long)local_1728 + lVar15),*(long *)((long)local_1718 + lVar15) + 1
                     );
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe418);
  if (local_1728[0] != local_1718) {
    operator_delete(local_1728[0],local_1718[0] + 1);
  }
  if (local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1708.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe438);
  if (local_16e8[0] != local_16d8) {
    operator_delete(local_16e8[0],local_16d8[0] + 1);
  }
  if (local_16c8[0] != (pointer)local_16b8) {
    operator_delete(local_16c8[0],local_16b8._0_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ab8);
  lVar15 = 0x330;
  do {
    if ((long *)(local_13e8 + lVar15) != *(long **)((long)local_13f8 + lVar15)) {
      operator_delete(*(long **)((long)local_13f8 + lVar15),*(long *)(local_13e8 + lVar15) + 1);
    }
    if ((long *)((long)local_1408 + lVar15) != *(long **)((long)local_1418 + lVar15)) {
      operator_delete(*(long **)((long)local_1418 + lVar15),*(long *)((long)local_1408 + lVar15) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar15));
    if ((long *)((long)local_1448 + lVar15) != *(long **)((long)local_1458 + lVar15)) {
      operator_delete(*(long **)((long)local_1458 + lVar15),*(long *)((long)local_1448 + lVar15) + 1
                     );
    }
    lVar15 = lVar15 + -0x88;
  } while (lVar15 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b78);
  if (local_1578 != &local_1568) {
    operator_delete(local_1578,local_1568 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
    operator_delete(local_1598._M_dataplus._M_p,local_1598.field_2._M_allocated_capacity + 1);
  }
  if (local_1558[0] != local_1548) {
    operator_delete(local_1558[0],local_1548[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b58);
  if (local_1538[0] != local_1528) {
    operator_delete(local_1538[0],local_1528[0] + 1);
  }
  if (local_1518[0] != local_1508) {
    operator_delete(local_1518[0],local_1508[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b38);
  if (local_14d8 != &local_14c8) {
    operator_delete(local_14d8,local_14c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f8._M_dataplus._M_p != &local_14f8.field_2) {
    operator_delete(local_14f8._M_dataplus._M_p,local_14f8.field_2._M_allocated_capacity + 1);
  }
  if (local_14b8[0] != local_14a8) {
    operator_delete(local_14b8[0],local_14a8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b18);
  if (local_1498[0] != local_1488) {
    operator_delete(local_1498[0],local_1488[0] + 1);
  }
  if (local_1478[0] != local_1468) {
    operator_delete(local_1478[0],local_1468[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1af8);
  if (local_1458[0] != local_1448) {
    operator_delete(local_1458[0],local_1448[0] + 1);
  }
  if (local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1438.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ad8);
  if (local_1418[0] != local_1408) {
    operator_delete(local_1418[0],local_1408[0] + 1);
  }
  if (local_13f8[0] != (pointer)local_13e8) {
    operator_delete(local_13f8[0],local_13e8._0_8_ + 1);
  }
  if (local_10a8[0] != local_1098) {
    operator_delete(local_10a8[0],local_1098[0] + 1);
  }
  if (local_1088[0] != local_1078) {
    operator_delete(local_1088[0],local_1078[0] + 1);
  }
  if (local_fe0[0] != local_fd0) {
    operator_delete(local_fe0[0],local_fd0[0] + 1);
  }
  if (local_fc0[0] != local_fb0) {
    operator_delete(local_fc0[0],local_fb0[0] + 1);
  }
  if (local_e08[0] != local_df8) {
    operator_delete(local_e08[0],local_df8[0] + 1);
  }
  if (local_de8[0] != local_dd8) {
    operator_delete(local_de8[0],local_dd8[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1a08);
  lVar15 = 0x630;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_6c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar15));
    plVar4 = *(long **)((long)&local_728 + lVar15 + 0x40);
    plVar11 = (long *)((long)&local_728 + lVar15 + 0x50);
    if (plVar11 != plVar4) {
      operator_delete(plVar4,*plVar11 + 1);
    }
    plVar11 = (long *)((long)&local_728 + lVar15 + 0x28);
    plVar4 = *(long **)((long)&local_728 + lVar15 + 0x18);
    if (plVar11 != plVar4) {
      operator_delete(plVar4,*plVar11 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_770 + lVar15));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_788.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar15));
    if ((long *)((long)local_7a0 + lVar15) != *(long **)((long)local_7b0 + lVar15)) {
      operator_delete(*(long **)((long)local_7b0 + lVar15),*(long *)((long)local_7a0 + lVar15) + 1);
    }
    lVar15 = lVar15 + -0x108;
  } while (lVar15 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d18);
  if (local_d38 != &local_d28) {
    operator_delete(local_d38,CONCAT71(uStack_d27,local_d28) + 1);
  }
  if (local_cf8[0] != local_ce8) {
    operator_delete(local_cf8[0],local_ce8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_cd8._M_first);
  if (local_c78[0] != local_c68) {
    operator_delete(local_c78[0],local_c68[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c30);
  if (local_c50 != &local_c40) {
    operator_delete(local_c50,CONCAT71(uStack_c3f,local_c40) + 1);
  }
  if (local_c10[0] != local_c00) {
    operator_delete(local_c10[0],local_c00[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_b98._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_bf0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_bf0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0.val._M_dataplus._M_p != &local_bf0.val.field_2) {
    operator_delete(local_bf0.val._M_dataplus._M_p,
                    CONCAT71(local_bf0.val.field_2._M_allocated_capacity._1_7_,
                             local_bf0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_b38[0] != local_b28) {
    operator_delete(local_b38[0],local_b28[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_af0);
  if (local_b10 != &local_b00) {
    operator_delete(local_b10,CONCAT71(uStack_aff,local_b00) + 1);
  }
  if (local_ad0[0] != local_ac0) {
    operator_delete(local_ad0[0],local_ac0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_a58._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_ab0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ab0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab0.val._M_dataplus._M_p != &local_ab0.val.field_2) {
    operator_delete(local_ab0.val._M_dataplus._M_p,
                    CONCAT71(local_ab0.val.field_2._M_allocated_capacity._1_7_,
                             local_ab0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_9f8[0] != local_9e8) {
    operator_delete(local_9f8[0],local_9e8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_9b0);
  if (local_9d0 != &local_9c0) {
    operator_delete(local_9d0,CONCAT71(uStack_9bf,local_9c0) + 1);
  }
  if (local_990[0] != local_980) {
    operator_delete(local_990[0],local_980[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_950._M_first);
  if (local_970 != &local_960) {
    operator_delete(local_970,CONCAT44(uStack_95c,local_960) + 1);
  }
  if (local_8f0[0] != local_8e0) {
    operator_delete(local_8f0[0],local_8e0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8a8);
  if (local_8c8 != &local_8b8) {
    operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
  }
  if (local_888[0] != local_878) {
    operator_delete(local_888[0],local_878[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_810._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_868.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_868.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.val._M_dataplus._M_p != &local_868.val.field_2) {
    operator_delete(local_868.val._M_dataplus._M_p,
                    CONCAT71(local_868.val.field_2._M_allocated_capacity._1_7_,
                             local_868.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_7b0[0] != local_7a0) {
    operator_delete(local_7b0[0],local_7a0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_768);
  if (local_788.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_788.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_788.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_788.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_788.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_748[0] != local_738) {
    operator_delete(local_748[0],local_738[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_728._M_first);
  if (local_6c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_6c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_6c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_6c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listsinceblock()
{
    return RPCHelpMan{"listsinceblock",
                "\nGet all transactions in blocks since block [blockhash], or all transactions if omitted.\n"
                "If \"blockhash\" is no longer a part of the main chain, transactions from the fork point onward are included.\n"
                "Additionally, if include_removed is set, transactions affecting the wallet which were removed are returned in the \"removed\" array.\n",
                {
                    {"blockhash", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "If set, the block hash to list transactions since, otherwise list all transactions."},
                    {"target_confirmations", RPCArg::Type::NUM, RPCArg::Default{1}, "Return the nth block hash from the main chain. e.g. 1 would mean the best block hash. Note: this is not used as a filter, but only affects [lastblock] in the return value"},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Include transactions to watch-only addresses (see 'importaddress')"},
                    {"include_removed", RPCArg::Type::BOOL, RPCArg::Default{true}, "Show transactions that were removed due to a reorg in the \"removed\" array\n"
                                                                       "(not guaranteed to work on pruned nodes)"},
                    {"include_change", RPCArg::Type::BOOL, RPCArg::Default{false}, "Also add entries for change outputs.\n"},
                    {"label", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Return only incoming transactions paying to addresses with the specified label.\n"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::ARR, "transactions", "",
                        {
                            {RPCResult::Type::OBJ, "", "", Cat(Cat<std::vector<RPCResult>>(
                            {
                                {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction."},
                                {RPCResult::Type::STR, "address",  /*optional=*/true, "The bitcoin address of the transaction (not returned if the output does not have an address, e.g. OP_RETURN null data)."},
                                {RPCResult::Type::STR, "category", "The transaction category.\n"
                                    "\"send\"                  Transactions sent.\n"
                                    "\"receive\"               Non-coinbase transactions received.\n"
                                    "\"generate\"              Coinbase transactions received with more than 100 confirmations.\n"
                                    "\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n"
                                    "\"orphan\"                Orphaned coinbase transactions received."},
                                {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT + ". This is negative for the 'send' category, and is positive\n"
                                    "for all other categories"},
                                {RPCResult::Type::NUM, "vout", "the vout value"},
                                {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the\n"
                                     "'send' category of transactions."},
                            },
                            TransactionDescriptionString()),
                            {
                                {RPCResult::Type::BOOL, "abandoned", "'true' if the transaction has been abandoned (inputs are respendable)."},
                                {RPCResult::Type::STR, "label", /*optional=*/true, "A comment for the address/transaction, if any"},
                            })},
                        }},
                        {RPCResult::Type::ARR, "removed", /*optional=*/true, "<structure is the same as \"transactions\" above, only present if include_removed=true>\n"
                            "Note: transactions that were re-added in the active chain will appear as-is in this array, and may thus have a positive confirmation count."
                        , {{RPCResult::Type::ELISION, "", ""},}},
                        {RPCResult::Type::STR_HEX, "lastblock", "The hash of the block (target_confirmations-1) from the best block on the main chain, or the genesis hash if the referenced block does not exist yet. This is typically used to feed back into listsinceblock the next time you call it. So you would generally use a target_confirmations of say 6, so you will be continually re-notified of transactions until they've reached 6 confirmations plus any new ones"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listsinceblock", "")
            + HelpExampleCli("listsinceblock", "\"000000000000000bacf66f7497b7dc45ef753ee9a7d38571037cdb1a57f663ad\" 6")
            + HelpExampleRpc("listsinceblock", "\"000000000000000bacf66f7497b7dc45ef753ee9a7d38571037cdb1a57f663ad\", 6")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    const CWallet& wallet = *pwallet;
    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    LOCK(wallet.cs_wallet);

    std::optional<int> height;    // Height of the specified block or the common ancestor, if the block provided was in a deactivated chain.
    std::optional<int> altheight; // Height of the specified block, even if it's in a deactivated chain.
    int target_confirms = 1;
    isminefilter filter = ISMINE_SPENDABLE;

    uint256 blockId;
    if (!request.params[0].isNull() && !request.params[0].get_str().empty()) {
        blockId = ParseHashV(request.params[0], "blockhash");
        height = int{};
        altheight = int{};
        if (!wallet.chain().findCommonAncestor(blockId, wallet.GetLastBlockHash(), /*ancestor_out=*/FoundBlock().height(*height), /*block1_out=*/FoundBlock().height(*altheight))) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
    }

    if (!request.params[1].isNull()) {
        target_confirms = request.params[1].getInt<int>();

        if (target_confirms < 1) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter");
        }
    }

    if (ParseIncludeWatchonly(request.params[2], wallet)) {
        filter |= ISMINE_WATCH_ONLY;
    }

    bool include_removed = (request.params[3].isNull() || request.params[3].get_bool());
    bool include_change = (!request.params[4].isNull() && request.params[4].get_bool());

    // Only set it if 'label' was provided.
    std::optional<std::string> filter_label;
    if (!request.params[5].isNull()) filter_label.emplace(LabelFromValue(request.params[5]));

    int depth = height ? wallet.GetLastBlockHeight() + 1 - *height : -1;

    UniValue transactions(UniValue::VARR);

    for (const std::pair<const uint256, CWalletTx>& pairWtx : wallet.mapWallet) {
        const CWalletTx& tx = pairWtx.second;

        if (depth == -1 || abs(wallet.GetTxDepthInMainChain(tx)) < depth) {
            ListTransactions(wallet, tx, 0, true, transactions, filter, filter_label, include_change);
        }
    }

    // when a reorg'd block is requested, we also list any relevant transactions
    // in the blocks of the chain that was detached
    UniValue removed(UniValue::VARR);
    while (include_removed && altheight && *altheight > *height) {
        CBlock block;
        if (!wallet.chain().findBlock(blockId, FoundBlock().data(block)) || block.IsNull()) {
            throw JSONRPCError(RPC_INTERNAL_ERROR, "Can't read block from disk");
        }
        for (const CTransactionRef& tx : block.vtx) {
            auto it = wallet.mapWallet.find(tx->GetHash());
            if (it != wallet.mapWallet.end()) {
                // We want all transactions regardless of confirmation count to appear here,
                // even negative confirmation ones, hence the big negative.
                ListTransactions(wallet, it->second, -100000000, true, removed, filter, filter_label, include_change);
            }
        }
        blockId = block.hashPrevBlock;
        --*altheight;
    }

    uint256 lastblock;
    target_confirms = std::min(target_confirms, wallet.GetLastBlockHeight() + 1);
    CHECK_NONFATAL(wallet.chain().findAncestorByHeight(wallet.GetLastBlockHash(), wallet.GetLastBlockHeight() + 1 - target_confirms, FoundBlock().hash(lastblock)));

    UniValue ret(UniValue::VOBJ);
    ret.pushKV("transactions", std::move(transactions));
    if (include_removed) ret.pushKV("removed", std::move(removed));
    ret.pushKV("lastblock", lastblock.GetHex());

    return ret;
},
    };
}